

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader_test.cc
# Opt level: O0

void __thiscall
fizplex::MPSReaderTest_MissingRowNameThrows_Test::TestBody
          (MPSReaderTest_MissingRowNameThrows_Test *this)

{
  bool bVar1;
  runtime_error *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string *in_stack_00000528;
  LP *this_00;
  AssertHelper local_f0;
  Message local_e8 [2];
  allocator<char> local_d1;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  ConstCharPtr local_10 [2];
  
  testing::internal::ConstCharPtr::ConstCharPtr(local_10,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_10);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      this_00 = (LP *)&local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      MPSReader::read_lp(in_stack_00000528);
      LP::~LP(this_00);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
      std::allocator<char>::~allocator(&local_d1);
    }
    local_10[0].value =
         "Expected: MPSReader::read_lp(\"./test/missing_row_name.mps\") throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_e8);
  testing::internal::AssertHelper::AssertHelper
            (&local_f0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/mpsreader_test.cc"
             ,0x1d,local_10[0].value);
  testing::internal::AssertHelper::operator=(&local_f0,local_e8);
  testing::internal::AssertHelper::~AssertHelper(&local_f0);
  testing::Message::~Message((Message *)0x1d3dda);
  return;
}

Assistant:

TEST(MPSReaderTest, MissingRowNameThrows) {
  EXPECT_THROW(MPSReader::read_lp("./test/missing_row_name.mps"),
               std::runtime_error);
}